

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O2

_Bool menu_handle_mouse(menu_conflict *menu,ui_event *in,ui_event *out)

{
  region_conflict *loc;
  _Bool _Var1;
  int cursor;
  ui_event_type uVar2;
  int *piVar3;
  
  if ((in->mouse).button == '\x02') {
LAB_001e5326:
    out->type = EVT_ESCAPE;
  }
  else {
    loc = &menu->active;
    _Var1 = region_inside((region *)loc,in);
    if (_Var1) {
      piVar3 = &menu->filter_count;
      if (menu->filter_list == (int *)0x0) {
        piVar3 = &menu->count;
      }
      cursor = (*menu->skin->get_cursor)
                         ((int)(in->mouse).y,(int)(in->mouse).x,*piVar3,menu->top,loc);
      _Var1 = is_valid_row(menu,cursor);
      if (_Var1) {
        if (cursor == menu->cursor) {
          uVar2 = EVT_SELECT;
        }
        else {
          uVar2 = (uint)((menu->flags & 0x10) == 0) * 0x20 + EVT_MOVE;
        }
        out->type = uVar2;
        menu->cursor = cursor;
        goto LAB_001e532c;
      }
    }
    else {
      _Var1 = region_inside((region *)loc,in);
      if ((!_Var1) && ((int)(uint)(in->mouse).x < loc->col)) goto LAB_001e5326;
    }
    if (menu->context_hook != (_func__Bool_menu_ptr_ui_event_ptr_ui_event_ptr_conflict *)0x0) {
      _Var1 = (*menu->context_hook)(menu,in,out);
      return _Var1;
    }
  }
LAB_001e532c:
  return out->type != EVT_NONE;
}

Assistant:

bool menu_handle_mouse(struct menu *menu, const ui_event *in,
		ui_event *out)
{
	int new_cursor;

	if (in->mouse.button == 2) {
		out->type = EVT_ESCAPE;
	} else if (!region_inside(&menu->active, in)) {
		/* A click to the left of the active region is 'back' */
		if (!region_inside(&menu->active, in)
				&& in->mouse.x < menu->active.col) {
			out->type = EVT_ESCAPE;
		} else if (menu->context_hook) {
			return (*menu->context_hook)(menu, in, out);
		}
	} else {
		int count = menu->filter_list ? menu->filter_count : menu->count;

		new_cursor = menu->skin->get_cursor(in->mouse.y, in->mouse.x,
				count, menu->top, &menu->active);
	
		if (is_valid_row(menu, new_cursor)) {
			if (new_cursor == menu->cursor || !(menu->flags & MN_DBL_TAP))
				out->type = EVT_SELECT;
			else
				out->type = EVT_MOVE;

			menu->cursor = new_cursor;
		} else if (menu->context_hook) {
			return (*menu->context_hook)(menu, in, out);
		}
	}

	return out->type != EVT_NONE;
}